

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmGraph.cpp
# Opt level: O1

void PrintFunction(InstructionVMGraphContext *ctx,VmFunction *function)

{
  uint uVar1;
  VmValueType VVar2;
  FunctionData *pFVar3;
  ArgumentData *pAVar4;
  long lVar5;
  long lVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  ModuleData *pMVar9;
  ScopeData *pSVar10;
  VariableData *pVVar11;
  char *pcVar12;
  VmConstant *pVVar13;
  char *pcVar14;
  char *pcVar15;
  ulong uVar16;
  bool bVar17;
  long lVar18;
  VmValue *value;
  ulong uVar19;
  VmBlock *block;
  ulong uVar20;
  
  pFVar3 = function->function;
  if (pFVar3 != (FunctionData *)0x0) {
    if ((pFVar3->importModule == (ModuleData *)0x0) || ((function->super_VmValue).users.count != 0))
    {
      PrintUsers(ctx,&function->super_VmValue,true);
      Print(ctx,"function ");
      PrintType(ctx,function->returnType);
      pcVar15 = (pFVar3->name->name).begin;
      Print(ctx," %.*s.f%04x(",(ulong)(uint)(*(int *)&(pFVar3->name->name).end - (int)pcVar15),
            pcVar15,(ulong)pFVar3->uniqueId);
      if ((pFVar3->arguments).count != 0) {
        lVar18 = 0;
        uVar16 = 0;
        do {
          pAVar4 = (pFVar3->arguments).data;
          pcVar15 = ", ";
          if (lVar18 == 0) {
            pcVar15 = "";
          }
          pcVar14 = "";
          if ((&pAVar4->isExplicit)[lVar18] != false) {
            pcVar14 = "explicit ";
          }
          lVar5 = *(long *)((long)&pAVar4->name + lVar18);
          lVar6 = *(long *)((long)&pAVar4->type + lVar18);
          uVar7 = *(undefined8 *)(lVar6 + 0x10);
          uVar8 = *(undefined8 *)(lVar5 + 0x40);
          Print(ctx,"%s%s%.*s %.*s",pcVar15,pcVar14,
                (ulong)(uint)(*(int *)(lVar6 + 0x18) - (int)uVar7),uVar7,
                (ulong)(uint)(*(int *)(lVar5 + 0x48) - (int)uVar8),uVar8);
          uVar16 = uVar16 + 1;
          lVar18 = lVar18 + 0x30;
        } while (uVar16 < (pFVar3->arguments).count);
      }
      pcVar15 = "";
      if (function->firstBlock == (VmBlock *)0x0) {
        pcVar15 = ";";
      }
      Print(ctx,")%s",pcVar15);
      pMVar9 = pFVar3->importModule;
      if (pMVar9 != (ModuleData *)0x0) {
        Print(ctx," from \'%.*s\'",
              (ulong)(uint)(*(int *)&(pMVar9->name).end - (int)(pMVar9->name).begin));
      }
      OutputContext::Print(ctx->output,"\n",1);
      if (function->firstBlock != (VmBlock *)0x0) goto LAB_001ccd03;
    }
    return;
  }
  PrintLine(ctx,"function global()");
LAB_001ccd03:
  pSVar10 = function->scope;
  if ((pSVar10 != (ScopeData *)0x0) && ((pSVar10->allVariables).count != 0)) {
    uVar16 = 0;
    do {
      pVVar11 = (pSVar10->allVariables).data[uVar16];
      if ((pVVar11->isAlloca != true) || ((pVVar11->users).count != 0)) {
        pcVar15 = "imported ";
        if (pVVar11->importModule == (ModuleData *)0x0) {
          pcVar15 = "";
        }
        pcVar14 = (pVVar11->type->name).begin;
        pcVar12 = (pVVar11->name->name).begin;
        Print(ctx,"// %s0x%x: %.*s %.*s",pcVar15,(ulong)pVVar11->offset,
              (ulong)(uint)(*(int *)&(pVVar11->type->name).end - (int)pcVar14),pcVar14,
              (ulong)(uint)(*(int *)&(pVVar11->name->name).end - (int)pcVar12),pcVar12);
        if (ctx->showUsers == true) {
          Print(ctx," [");
        }
        if ((pVVar11->users).count == 0) {
          bVar17 = false;
        }
        else {
          uVar20 = 0;
          bVar17 = false;
          do {
            pVVar13 = (pVVar11->users).data[uVar20];
            if ((pVVar13->super_VmValue).users.count != 0) {
              uVar19 = 0;
              do {
                if (((int)uVar19 != 0 || (int)uVar20 != 0) && (ctx->showUsers != false)) {
                  Print(ctx,", ");
                }
                if ((pVVar13->super_VmValue).users.count <= uVar19) {
                  pcVar15 = 
                  "T &SmallArray<VmValue *, 8>::operator[](unsigned int) [T = VmValue *, N = 8]";
                  goto LAB_001cd09e;
                }
                value = (pVVar13->super_VmValue).users.data[uVar19];
                if ((value == (VmValue *)0x0) || (value->typeID != 2)) {
                  value = (VmValue *)0x0;
                }
                if (value == (VmValue *)0x0) {
                  __assert_fail("!\"invalid constant use\"",
                                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmGraph.cpp"
                                ,0x2b3,
                                "void PrintFunction(InstructionVMGraphContext &, VmFunction *)");
                }
                if (ctx->showUsers == true) {
                  PrintName(ctx,value,(VmFunction *)value[1].users.data[0x16] != function,true);
                }
                uVar1 = *(uint *)&value[1]._vptr_VmValue;
                if (uVar1 < 7) goto LAB_001ccf25;
                if (uVar1 - 8 < 7) {
                  if (value[1].type.type != VM_TYPE_VOID) {
                    if ((VmConstant *)**(long **)&value[1].typeID == pVVar13) goto LAB_001ccf25;
                    goto LAB_001cce8e;
                  }
LAB_001cd089:
                  pcVar15 = 
                  "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]";
LAB_001cd09e:
                  __assert_fail("index < count",
                                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                                ,0x199,pcVar15);
                }
LAB_001cce8e:
                if (uVar1 == 0x1a) {
                  if (value[1].type.type != VM_TYPE_VOID) {
                    if ((VmConstant *)**(long **)&value[1].typeID == pVVar13) goto LAB_001ccf25;
                    goto LAB_001ccee1;
                  }
                  goto LAB_001cd089;
                }
                if (uVar1 == 0x1b) {
                  VVar2 = value[1].type.type;
                  if (VVar2 == VM_TYPE_VOID) goto LAB_001cd089;
                  if ((VmConstant *)**(long **)&value[1].typeID != pVVar13) {
                    if (VVar2 < VM_TYPE_LONG) goto LAB_001cd089;
                    if ((VmConstant *)(*(long **)&value[1].typeID)[2] != pVVar13) goto LAB_001ccee1;
                  }
                }
                else {
LAB_001ccee1:
                  if (uVar1 - 0x1f < 2) {
                    if (pVVar13->isReference == false) {
                      bVar17 = true;
                    }
                  }
                  else {
                    if (uVar1 - 0x33 < 0x11) {
                      if (value[1].type.type < VM_TYPE_DOUBLE) goto LAB_001cd089;
                      if (*(VmConstant **)(*(long *)&value[1].typeID + 8) == pVVar13)
                      goto LAB_001ccf25;
                    }
                    bVar17 = true;
                  }
                }
LAB_001ccf25:
                uVar19 = uVar19 + 1;
              } while (uVar19 < (pVVar13->super_VmValue).users.count);
            }
            uVar20 = uVar20 + 1;
          } while (uVar20 < (pVVar11->users).count);
        }
        if (ctx->showUsers != false) {
          Print(ctx,"]");
        }
        if (!bVar17) {
          Print(ctx," noalias");
        }
        if (pVVar11->isAlloca == true) {
          Print(ctx," alloca");
        }
        pMVar9 = pVVar11->importModule;
        if (pMVar9 != (ModuleData *)0x0) {
          Print(ctx," from \'%.*s\'",
                (ulong)(uint)(*(int *)&(pMVar9->name).end - (int)(pMVar9->name).begin));
        }
        OutputContext::Print(ctx->output,"\n",1);
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 < (pSVar10->allVariables).count);
  }
  PrintLine(ctx,"{");
  for (block = function->firstBlock; block != (VmBlock *)0x0; block = block->nextSibling) {
    PrintBlock(ctx,block);
  }
  PrintLine(ctx,"}");
  OutputContext::Print(ctx->output,"\n",1);
  return;
}

Assistant:

void PrintFunction(InstructionVMGraphContext &ctx, VmFunction *function)
{
	if(FunctionData *fData = function->function)
	{
		if(fData->importModule != NULL && function->users.empty())
			return;

		PrintUsers(ctx, function, true);

		Print(ctx, "function ");
		PrintType(ctx, function->returnType);
		Print(ctx, " %.*s.f%04x(", FMT_ISTR(fData->name->name), fData->uniqueId);

		for(unsigned i = 0; i < fData->arguments.size(); i++)
		{
			ArgumentData &argument = fData->arguments[i];

			Print(ctx, "%s%s%.*s %.*s", i == 0 ? "" : ", ", argument.isExplicit ? "explicit " : "", FMT_ISTR(argument.type->name), FMT_ISTR(argument.name->name));
		}

		Print(ctx, ")%s", function->firstBlock == NULL ? ";" : "");

		if(fData->importModule)
			Print(ctx, " from '%.*s'", FMT_ISTR(fData->importModule->name));

		PrintLine(ctx);

		if(function->firstBlock == NULL)
			return;
	}
	else
	{
		PrintLine(ctx, "function global()");
	}

	if(ScopeData *scope = function->scope)
	{
		for(unsigned i = 0; i < scope->allVariables.size(); i++)
		{
			VariableData *variable = scope->allVariables[i];

			if(variable->isAlloca && variable->users.empty())
				continue;

			Print(ctx, "// %s0x%x: %.*s %.*s", variable->importModule ? "imported " : "", variable->offset, FMT_ISTR(variable->type->name), FMT_ISTR(variable->name->name));

			if(ctx.showUsers)
				Print(ctx, " [");

			bool addressTaken = false;

			for(unsigned i = 0; i < variable->users.size(); i++)
			{
				VmConstant *user = variable->users[i];

				for(unsigned k = 0; k < user->users.size(); k++)
				{
					if(ctx.showUsers)
					{
						if(i != 0 || k != 0)
							Print(ctx, ", ");
					}

					if(VmInstruction *inst = getType<VmInstruction>(user->users[k]))
					{
						if(ctx.showUsers)
							PrintName(ctx, inst, inst->parent->parent != function, true);

						bool simpleUse = false;

						if(inst->cmd >= VM_INST_LOAD_BYTE && inst->cmd <= VM_INST_LOAD_STRUCT)
						{
							simpleUse = true;
						}
						else if(inst->cmd >= VM_INST_STORE_BYTE && inst->cmd <= VM_INST_STORE_STRUCT && inst->arguments[0] == user)
						{
							simpleUse = true;
						}
						else if(inst->cmd == VM_INST_MEM_COPY && (inst->arguments[0] == user || inst->arguments[2] == user))
						{
							simpleUse = true;
						}
						else if(inst->cmd == VM_INST_SET_RANGE && inst->arguments[0] == user)
						{
							simpleUse = true;
						}
						else if(inst->cmd == VM_INST_RETURN || inst->cmd == VM_INST_CALL)
						{
							if(user->isReference)
								simpleUse = true;
							else
								simpleUse = false;
						}
						else if(inst->cmd >= VM_INST_ADD_LOAD && inst->cmd <= VM_INST_BIT_XOR_LOAD && inst->arguments[1] == user)
						{
							simpleUse = true;
						}
						else
						{
							simpleUse = false;
						}

						if(!simpleUse)
							addressTaken = true;
					}
					else
					{
						assert(!"invalid constant use");
					}
				}
			}

			if(ctx.showUsers)
				Print(ctx, "]");

			if(!addressTaken)
				Print(ctx, " noalias");

			if(variable->isAlloca)
				Print(ctx, " alloca");

			if(variable->importModule)
				Print(ctx, " from '%.*s'", FMT_ISTR(variable->importModule->name));

			PrintLine(ctx);
		}
	}

	PrintLine(ctx, "{");

	for(VmBlock *value = function->firstBlock; value; value = value->nextSibling)
		PrintBlock(ctx, value);
	
	PrintLine(ctx, "}");
	PrintLine(ctx);
}